

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O3

string * __thiscall
google::protobuf::gtest_ArenaStringSingleArena_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,TestParamInfo<bool> *info)

{
  bool bVar1;
  ValueArray local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) goto LAB_0054f831;
  testing::internal::ValueArray::operator_cast_to_ParamGenerator(local_28);
  if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0054f831;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_20->_M_use_count = local_20->_M_use_count + 1;
    UNLOCK();
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0054f824;
  }
  else {
    local_20->_M_use_count = local_20->_M_use_count + 1;
LAB_0054f824:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
LAB_0054f831:
  testing::internal::DefaultParamName<bool>(__return_storage_ptr__,(TestParamInfo<bool> *)this);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(SingleArena, GetSet) {
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitDefault();
  EXPECT_EQ("", field.Get());
  field.Set("Test short", arena.get());
  EXPECT_EQ("Test short", field.Get());
  field.Set("Test long long long long value", arena.get());
  EXPECT_EQ("Test long long long long value", field.Get());
  field.Set("", arena.get());
  field.Destroy();
}